

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

imagef * __thiscall basisu::imagef::set(imagef *this,image *src,vec4F *scale,vec4F *bias)

{
  uint32_t w;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar7;
  vec4F *pvVar8;
  uint32_t x;
  uint32_t h;
  uint32_t x_00;
  uint32_t y;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar9 [16];
  vec4F local_48;
  
  w = src->m_width;
  h = src->m_height;
  local_48.m_v[0] = 0.0;
  local_48.m_v[1] = 0.0;
  local_48.m_v[2] = 0.0;
  local_48.m_v[3] = 1.0;
  crop(this,w,h,0xffffffff,&local_48);
  y = 0;
  if ((int)h < 1) {
    h = y;
  }
  for (; y != h; y = y + 1) {
    for (x_00 = 0; w != x_00; x_00 = x_00 + 1) {
      paVar7 = &image::operator()(src,x_00,y)->field_0;
      pvVar8 = operator()(this,x_00,y);
      auVar9 = pmovzxbd(extraout_XMM0,*paVar7);
      fVar1 = scale->m_v[1];
      fVar2 = scale->m_v[2];
      fVar3 = scale->m_v[3];
      fVar4 = bias->m_v[1];
      fVar5 = bias->m_v[2];
      fVar6 = bias->m_v[3];
      pvVar8->m_v[0] = bias->m_v[0] + scale->m_v[0] * (float)auVar9._0_4_;
      pvVar8->m_v[1] = fVar4 + fVar1 * (float)auVar9._4_4_;
      pvVar8->m_v[2] = fVar5 + fVar2 * (float)auVar9._8_4_;
      pvVar8->m_v[3] = fVar6 + fVar3 * (float)auVar9._12_4_;
    }
  }
  return this;
}

Assistant:

imagef &set(const image &src, const vec4F &scale = vec4F(1), const vec4F &bias = vec4F(0))
		{
			const uint32_t width = src.get_width();
			const uint32_t height = src.get_height();

			resize(width, height);

			for (int y = 0; y < (int)height; y++)
			{
				for (uint32_t x = 0; x < width; x++)
				{
					const color_rgba &src_pixel = src(x, y);
					(*this)(x, y).set((float)src_pixel.r * scale[0] + bias[0], (float)src_pixel.g * scale[1] + bias[1], (float)src_pixel.b * scale[2] + bias[2], (float)src_pixel.a * scale[3] + bias[3]);
				}
			}

			return *this;
		}